

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O1

void __thiscall IntervalsTest_TestEmpty_Test::TestBody(IntervalsTest_TestEmpty_Test *this)

{
  char *message;
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> expected;
  long local_30;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ::wasm::IntervalProcessor::filterOverlaps
            ((vector *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_28,"IntervalProcessor::filterOverlaps(intervals)","expected",
             (vector<int,_std::allocator<int>_> *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(vector<int,_std::allocator<int>_> *)auStack_58);
  if (expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    local_30 -
                    (long)expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,10,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      (**(code **)(*(long *)expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return;
}

Assistant:

TEST(IntervalsTest, TestEmpty) {
  std::vector<Interval> intervals;
  std::vector<int> expected;
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}